

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O3

void RDL_checkDependencies(RDL_cfURF *RCFs,RDL_graph *graph,RDL_URFinfo *uInfo)

{
  RDL_cfam **ppRVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar **rows;
  uchar **rows_00;
  uchar **rows_01;
  void *__ptr;
  uchar *empty_cycle;
  uint *puVar6;
  uchar *bitset;
  uchar *bitset_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uchar **ppuVar15;
  ulong uVar16;
  ulong local_b8;
  uint local_ac;
  ulong local_90;
  
  uVar5 = (ulong)RCFs->nofFams;
  if (uVar5 < 3) {
    uVar3 = uInfo->nofWeights;
    if (uVar3 != 0) {
      puVar6 = uInfo->nofProtos;
      uVar5 = 0;
      do {
        if (puVar6[uVar5] != 0) {
          uVar10 = 0;
          do {
            uInfo->URFrel[uVar5][uVar10][uVar10] = '\x01';
            uVar10 = uVar10 + 1;
            puVar6 = uInfo->nofProtos;
          } while (uVar10 < puVar6[uVar5]);
          uVar3 = uInfo->nofWeights;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
      uVar5 = (ulong)RCFs->nofFams;
    }
    if ((int)uVar5 != 0) {
      ppRVar1 = RCFs->fams;
      uVar10 = 0;
      do {
        ppRVar1[uVar10]->mark = 1;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    return;
  }
  rows = (uchar **)malloc((ulong)((graph->E - graph->V) + 1) << 3);
  rows_00 = (uchar **)malloc(uVar5 * 8);
  rows_01 = (uchar **)malloc(uVar5 * 8);
  __ptr = malloc(uVar5 << 2);
  uVar5 = 0;
  ppuVar15 = rows_00;
  do {
    uVar3 = RDL_bitset_compressed(ppuVar15,RCFs->fams[uVar5]->prototype,graph->E);
    uVar5 = uVar5 + 1;
    ppuVar15 = ppuVar15 + 1;
  } while (uVar5 < RCFs->nofFams);
  uVar5 = (ulong)uVar3;
  empty_cycle = (uchar *)calloc(1,uVar5);
  uVar11 = uInfo->nofWeights;
  if (uVar11 == 0) {
    free(rows);
  }
  else {
    puVar6 = uInfo->nofProtos;
    uVar16 = 0;
    local_ac = 0;
    uVar10 = 0;
    do {
      local_b8 = uVar10;
      if (puVar6[uVar16] != 0) {
        uVar11 = (uint)uVar10;
        local_90 = 0;
        uVar8 = local_ac;
        do {
          if (uVar16 == 0) {
            iVar12 = 0;
          }
          else {
            uVar7 = 0;
            iVar12 = 0;
            do {
              iVar12 = iVar12 + puVar6[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar16 != uVar7);
          }
          bitset = (uchar *)malloc(uVar5);
          memcpy(bitset,rows_00[(uint)(iVar12 + (int)local_90)],uVar5);
          if (uVar11 != 0) {
            uVar7 = 0;
            do {
              uVar2 = RDL_bitset_test(bitset,(uint)uVar7);
              if (uVar2 != '\0') {
                RDL_bitset_xor_inplace(bitset,rows[uVar7],uVar3);
              }
              uVar7 = uVar7 + 1;
            } while (uVar10 != uVar7);
          }
          iVar4 = RDL_bitset_empty(bitset,empty_cycle,uVar3);
          if (iVar4 == 0) {
            rows_01[uVar8] = bitset;
            *(int *)((long)__ptr + (ulong)uVar8 * 4) = (int)local_90;
            RCFs->fams[(uint)(iVar12 + (int)local_90)]->mark = 1;
            uInfo->URFrel[uVar16][local_90][local_90] = '\x01';
            bitset_00 = (uchar *)malloc(uVar5);
            memcpy(bitset_00,bitset,uVar5);
            ppuVar15 = rows + uVar10;
            uVar13 = uVar11;
            if (uVar11 < (uint)local_b8) {
              do {
                uVar2 = RDL_bitset_test(bitset_00,uVar13);
                if (uVar2 != '\0') {
                  RDL_bitset_xor_inplace(bitset_00,*ppuVar15,uVar3);
                }
                uVar13 = uVar13 + 1;
                ppuVar15 = ppuVar15 + 1;
              } while ((uint)local_b8 != uVar13);
            }
            uVar13 = uVar8 + 1;
            iVar12 = RDL_bitset_empty(bitset_00,empty_cycle,uVar3);
            if (iVar12 == 0) {
              rows[local_b8] = bitset_00;
              uVar8 = (uint)local_b8 + 1;
              uVar2 = RDL_bitset_test(bitset_00,(uint)local_b8);
              if (uVar2 == '\0') {
                uVar9 = uVar8;
                if (uVar8 < graph->E) {
                  do {
                    uVar2 = RDL_bitset_test(bitset_00,uVar9);
                    if (uVar2 != '\0') {
                      RDL_swap_columns(rows,uVar8,(uint)local_b8,uVar9);
                      RDL_swap_columns(rows_01,uVar13,(uint)local_b8,uVar9);
                      RDL_swap_columns(rows_00,RCFs->nofFams,(uint)local_b8,uVar9);
                      break;
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < graph->E);
                }
                local_b8 = (ulong)uVar8;
                uVar8 = uVar13;
              }
              else {
                local_b8 = (ulong)uVar8;
                uVar8 = uVar13;
              }
            }
            else {
              if (local_ac < uVar8) {
                lVar14 = 0;
                do {
                  memcpy(bitset_00,bitset,uVar5);
                  RDL_bitset_xor_inplace(bitset_00,rows_01[(ulong)local_ac + lVar14],uVar3);
                  iVar12 = RDL_bitset_empty(bitset_00,empty_cycle,uVar3);
                  if (iVar12 != 0) {
                    uVar9 = *(uint *)((long)__ptr + lVar14 * 4 + (ulong)local_ac * 4);
                    uInfo->URFrel[uVar16][local_90][uVar9] = '\x01';
                    uInfo->URFrel[uVar16][uVar9][local_90] = '\x01';
                  }
                  lVar14 = lVar14 + 1;
                } while (uVar8 - local_ac != (int)lVar14);
              }
              free(bitset_00);
              uVar8 = uVar13;
            }
          }
          else {
            free(bitset);
          }
          local_90 = local_90 + 1;
          puVar6 = uInfo->nofProtos;
        } while (local_90 < puVar6[uVar16]);
        uVar11 = uInfo->nofWeights;
        local_ac = uVar8;
      }
      uVar16 = uVar16 + 1;
      uVar10 = local_b8;
    } while (uVar16 < uVar11);
    if ((int)local_b8 != 0) {
      uVar5 = 0;
      do {
        free(rows[uVar5]);
        uVar5 = uVar5 + 1;
      } while (local_b8 != uVar5);
    }
    free(rows);
    if (local_ac != 0) {
      uVar5 = 0;
      do {
        free(rows_01[uVar5]);
        uVar5 = uVar5 + 1;
      } while (local_ac != uVar5);
    }
  }
  free(rows_01);
  free(__ptr);
  if (RCFs->nofFams != 0) {
    uVar5 = 0;
    do {
      free(rows_00[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < RCFs->nofFams);
  }
  free(rows_00);
  free(empty_cycle);
  return;
}

Assistant:

void RDL_checkDependencies(RDL_cfURF *RCFs, RDL_graph *graph, RDL_URFinfo *uInfo)
{
  unsigned i,j,k, index;

  /* this array contains the basis cycles in row echelon form */
  unsigned char **compressedBasisCycles;
  unsigned maxBasisCyclesSize = graph->E - graph->V + 1;
  unsigned currentBasisCyclesSize = 0;
  unsigned currentBasisCyclesSmallerEnd = 0;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;

  unsigned char **compressedRelevantCycles;
  unsigned currentRelevantCyclesSize = 0;
  unsigned currentRelevantCyclesSmallerEnd = 0;
  unsigned *relevantCyclesMap;

  unsigned char *compressedCycleWithSmallerAdded;
  unsigned char *compressedCycleWithEqualAdded;
  unsigned char **compressedPrototypesForGaussian;

  const unsigned char* empty_cycle;

  if(RCFs->nofFams < 3) {
    /*if only 0, 1 or 2 families exist, they are all relevant and independent*/
    for(i=0; i<uInfo->nofWeights; ++i) {
      for(j=0; j<uInfo->nofProtos[i]; ++j) {
        uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/
      }
    }
    for(i=0; i<RCFs->nofFams; ++i) {
      RCFs->fams[i]->mark = 1;
    }
    return;
  }

  compressedBasisCycles = malloc(maxBasisCyclesSize * sizeof(*compressedBasisCycles));
  compressedPrototypesForGaussian = malloc(RCFs->nofFams * sizeof(*compressedPrototypesForGaussian));
  compressedRelevantCycles = malloc(RCFs->nofFams * sizeof(*compressedRelevantCycles));
  relevantCyclesMap = malloc(RCFs->nofFams * sizeof(*relevantCyclesMap));

  /* copy the prototypes for gaussian elimination */
  for (i = 0; i < RCFs->nofFams; ++i) {
    compressedSize = RDL_bitset_compressed(
        &(compressedPrototypesForGaussian[i]), RCFs->fams[i]->prototype, graph->E);
  }
  empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
  memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));
  /* printf("%d %d\n", compressedSize, graph->E); */

  /* iterate over all weights */
  for (i = 0; i < uInfo->nofWeights; ++i) {
    /* reset indices indication the first index of larger cycles */
    currentBasisCyclesSmallerEnd = currentBasisCyclesSize;
    currentRelevantCyclesSmallerEnd = currentRelevantCyclesSize;
    for (j = 0; j < uInfo->nofProtos[i]; ++j) {

      index = RDL_idxWeights(uInfo, i, j);
      /* copy current cycle */
      compressedCycleWithSmallerAdded = malloc(compressedSize * sizeof(*compressedCycleWithSmallerAdded));
      memcpy(compressedCycleWithSmallerAdded, compressedPrototypesForGaussian[index],
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add smaller cycles of the basis (set B<)
       *
       * the basisCycles are in row echelon form (see below), so we add each cycle that
       * has a 1 at position k (all smaller positions are 0, row echelon)
       *
       * [this corresponds to the "add row operation" of gaussian elimination]
       */
      for (k = 0; k < currentBasisCyclesSmallerEnd; ++k) {
        if (RDL_bitset_test(compressedCycleWithSmallerAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithSmallerAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      /*
       * if the result is empty, then this cycle linearly depends
       * on smaller cycles of the basis B<
       *
       * => trivial
       * <= is also true because adding more smaller cycles can't make
       * the cycle 0 (how could it?)
       */
      if (RDL_bitset_empty(compressedCycleWithSmallerAdded, empty_cycle, compressedSize)) {
        free(compressedCycleWithSmallerAdded);
        continue;
      }

      /* this cycle does not depend on strictly smaller cycles => relevant */
      compressedRelevantCycles[currentRelevantCyclesSize] = compressedCycleWithSmallerAdded;
      relevantCyclesMap[currentRelevantCyclesSize] = j; /* this is no bug, we really need the "internal" index */
      ++currentRelevantCyclesSize;

      RCFs->fams[index]->mark = 1;
      uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/

      /* make a copy for adding the equal sized cycles */
      compressedCycleWithEqualAdded = malloc(compressedSize * sizeof(*compressedCycleWithEqualAdded));
      memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add equal sized cycles of the basis (set B=)
       *
       * the same arguments as for the smaller cycles apply
       */
      for (k = currentBasisCyclesSmallerEnd; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
        /*
         * if the cycle depends linearly on any equal sized cycle of the
         * basis (B=), we check all RELEVANT cycles we've seen so far for
         * linear dependence
         *
         * (-1 because we don't have to add the ring to itself)
         */

        for (k = currentRelevantCyclesSmallerEnd; k < currentRelevantCyclesSize-1; ++k) {
          memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
              compressedSize * sizeof(*compressedCycleWithSmallerAdded));
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedRelevantCycles[k], compressedSize);
          if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
            /*
             * if there is any equal sized cycle that is in fact equal to the current cycle
             * (after adding smaller cycles) => those cycles fulfill URF condition 1 (equal size)
             * and also condition 3 (depended on each other and smaller cycles)
             */
            uInfo->URFrel[i][j][relevantCyclesMap[k]] = 1;
            uInfo->URFrel[i][relevantCyclesMap[k]][j] = 1;
          }
        }

        free(compressedCycleWithEqualAdded);
      }
      else {
        /*
         * the current cycle is also independent of equal sized cycles,
         * so it's part of the basis, add it to B=
         *
         * (so it can't be depedent of any equal sized ring seen so far,
         * so URF relation is out of discussion)
         */
        oldBasisCyclesSize = currentBasisCyclesSize;
        compressedBasisCycles[currentBasisCyclesSize] = compressedCycleWithEqualAdded;
        ++currentBasisCyclesSize;

        /*
         * this is where the magic is happening: ensure that the basis is
         * indeed in row echelon form (we use the property throughout the algorithm)
         *
         * swap columns such that indeed the current ring with index currentBasisCycleSize-1
         * has a 1 at column currentBasisCycleSize-1
         * => ROW ECHELON FORM
         *
         * [this corresponds to the "swap columns operation" of gaussian elimination]
         */
        if (!RDL_bitset_test(compressedCycleWithEqualAdded, oldBasisCyclesSize)) {
          for (k = oldBasisCyclesSize + 1; k < graph->E; ++k) {
            if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
              RDL_swap_columns(compressedBasisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedRelevantCycles, currentRelevantCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedPrototypesForGaussian, RCFs->nofFams, oldBasisCyclesSize, k);
              break;
            }
          }
        }
      }

    }
  }

  for (i = 0; i < currentBasisCyclesSize; ++i) {
    free(compressedBasisCycles[i]);
  }
  free(compressedBasisCycles);

  for (i = 0; i < currentRelevantCyclesSize; ++i) {
    free(compressedRelevantCycles[i]);
  }
  free(compressedRelevantCycles);
  free(relevantCyclesMap);

  for (i = 0; i < RCFs->nofFams; ++i) {
    free(compressedPrototypesForGaussian[i]);
  }
  free(compressedPrototypesForGaussian);
  free((void*)empty_cycle);
}